

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O1

int lws_client_interpret_server_handshake(lws *wsi)

{
  byte *pbVar1;
  allocated_headers *paVar2;
  lws_dll2 *plVar3;
  allocated_headers *paVar4;
  lws_dll2 *d;
  ah_data_idx_t aVar5;
  int iVar6;
  lws *plVar7;
  char *pcVar8;
  char *pcVar9;
  lws_filepos_t lVar10;
  size_t sVar11;
  lws_role_ops *ops;
  ulong uVar12;
  size_t len;
  lws_close_status reason;
  uint ssl;
  lws *in_RDI;
  char *cce;
  int port;
  char *path;
  char *ads;
  char *prot;
  lws *local_60;
  char *local_58;
  uint local_4c;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_4c = 0;
  local_40 = (char *)0x0;
  local_58 = (char *)0x0;
  local_60 = in_RDI;
  plVar7 = lws_get_network_wsi(in_RDI);
  lws_realloc(local_60->stash,0,"free");
  local_60->stash = (client_info_stash *)0x0;
  paVar2 = (local_60->http).ah;
  if ((*(ulong *)&local_60->field_0x2dc >> 0x2d & 1) == 0) {
    if ((*(ulong *)&local_60->field_0x2dc & 0xc0000000000000) == 0) {
      _lws_log(0x10,"%s: %p: transitioning to h1 client\n","lws_client_interpret_server_handshake");
      ops = &role_ops_h1;
    }
    else {
      _lws_log(0x10,"%s: %p: transitioning to h2 client\n","lws_client_interpret_server_handshake");
      ops = &role_ops_h2;
    }
    lws_role_transition(local_60,0x10000000,LRS_ESTABLISHED,ops);
    (local_60->http).ah = paVar2;
    paVar2->http_response = 0;
  }
  (local_60->http).conn_type = HTTP_CONNECTION_KEEP_ALIVE;
  if ((local_60->field_0x2e2 & 0x80) == 0) {
    pcVar8 = lws_hdr_simple_ptr(local_60,WSI_TOKEN_HTTP);
    if (pcVar8 == (char *)0x0) {
      pcVar8 = lws_hdr_simple_ptr(local_60,WSI_TOKEN_HTTP1_0);
      (local_60->http).conn_type = HTTP_CONNECTION_CLOSE;
    }
    if (pcVar8 == (char *)0x0) {
      local_58 = "HS: URI missing";
      pcVar8 = "no URI\n";
      goto LAB_001277df;
    }
LAB_00127656:
    aVar5 = atoi(pcVar8);
    if (paVar2 != (allocated_headers *)0x0) {
      paVar2->http_response = aVar5;
    }
    uVar12 = *(ulong *)&local_60->field_0x2dc;
    if ((((uVar12 >> 0x3a & 1) != 0) || (7 < aVar5 - 0x12d)) ||
       ((199U >> (aVar5 - 0x12d & 0x1f) & 1) == 0)) {
      if ((uVar12 & 0x200000000000) == 0) {
        if ((uVar12 & 0xc0000000000000) == 0) {
          if ((local_60->http).conn_type == HTTP_CONNECTION_KEEP_ALIVE) {
            *(ulong *)&local_60->field_0x2dc = uVar12 | 0x4000000000000;
          }
          else {
            *(ulong *)&local_60->field_0x2dc = uVar12 | 0x8000000000000;
            d = (local_60->dll2_cli_txn_queue_owner).head;
            while (d != (lws_dll2 *)0x0) {
              plVar3 = d->next;
              lws_dll2_remove(d);
              pbVar1 = (byte *)((long)&d[0xb].owner + 2);
              *pbVar1 = *pbVar1 & 0xdf;
              lws_role_transition((lws *)(d + -0x13),0x10000000,LRS_UNCONNECTED,&role_ops_h1);
              d[6].owner = (lws_dll2_owner *)0x0;
              d = plVar3;
            }
          }
        }
        iVar6 = lws_ensure_user_space(local_60);
        if (iVar6 == 0) {
          *(ulong *)&local_60->field_0x2dc = *(ulong *)&local_60->field_0x2dc & 0xffffbfffffffffff;
          local_60->chunk_remaining = 0;
          iVar6 = lws_hdr_total_length(local_60,WSI_TOKEN_HTTP_TRANSFER_ENCODING);
          if (iVar6 != 0) {
            pcVar8 = lws_hdr_simple_ptr(local_60,WSI_TOKEN_HTTP_TRANSFER_ENCODING);
            iVar6 = strcmp(pcVar8,"chunked");
            uVar12 = 0;
            if (iVar6 == 0) {
              uVar12 = 0x400000000000;
            }
            *(ulong *)&local_60->field_0x2dc =
                 *(ulong *)&local_60->field_0x2dc & 0xffffbfffffffffff | uVar12;
            local_60->chunk_parser = '\0';
          }
          iVar6 = lws_hdr_total_length(local_60,WSI_TOKEN_HTTP_CONTENT_LENGTH);
          if (iVar6 == 0) {
            if ((*(ulong *)&local_60->field_0x2dc & 0x400000000000) == 0) {
              (local_60->http).conn_type = HTTP_CONNECTION_CLOSE;
            }
          }
          else {
            pcVar8 = lws_hdr_simple_ptr(local_60,WSI_TOKEN_HTTP_CONTENT_LENGTH);
            lVar10 = atoll(pcVar8);
            (local_60->http).rx_content_length = lVar10;
            _lws_log(8,"%s: incoming content length %llu\n","lws_client_interpret_server_handshake",
                     lVar10);
            (local_60->http).rx_content_remain = (local_60->http).rx_content_length;
          }
          paVar4 = (local_60->http).ah;
          (local_60->http).ah = paVar2;
          iVar6 = (*local_60->protocol->callback)
                            (local_60,LWS_CALLBACK_CLIENT_FILTER_PRE_ESTABLISH,local_60->user_space,
                             (void *)0x0,0);
          if (iVar6 == 0) {
            lws_set_timeout(local_60,NO_PENDING_TIMEOUT,0);
            *(ulong *)&local_60->field_0x2dc =
                 *(ulong *)&local_60->field_0x2dc & 0xffffffffffff9fff | 0x2000;
            iVar6 = (*local_60->protocol->callback)
                              (local_60,LWS_CALLBACK_ESTABLISHED_CLIENT_HTTP,local_60->user_space,
                               (void *)0x0,0);
            (local_60->http).ah = paVar4;
            if (iVar6 == 0) {
              _lws_log(8,"%s: client connection up\n","lws_client_interpret_server_handshake");
              iVar6 = lws_hdr_total_length(local_60,WSI_TOKEN_HTTP_CONTENT_LENGTH);
              if (iVar6 == 0) {
                return 0;
              }
              if ((local_60->http).rx_content_length == 0) {
                iVar6 = lws_http_transaction_completed_client((lws *)0x127c27);
                return (uint)(iVar6 != 0);
              }
              return 0;
            }
            local_58 = "HS: disallowed at ESTABLISHED";
            goto LAB_00127ae2;
          }
          (local_60->http).ah = paVar4;
          local_58 = "HS: disallowed by client filter";
        }
        else {
          _lws_log(1,"Problem allocating wsi user mem\n");
          local_58 = "HS: OOM";
        }
      }
      else {
        iVar6 = lws_client_ws_upgrade(local_60,&local_58);
        if (iVar6 != 2) {
          if (iVar6 != 3) {
            return 0;
          }
          goto LAB_00127ae2;
        }
      }
      reason = LWS_CLOSE_STATUS_PROTOCOL_ERR;
      goto LAB_00127ae4;
    }
    pcVar8 = lws_hdr_simple_ptr(local_60,WSI_TOKEN_HTTP_LOCATION);
    if (pcVar8 == (char *)0x0) {
      local_58 = "HS: Redirect code but no Location";
    }
    else {
      if (aVar5 == 0x12f) {
        pcVar9 = lws_hdr_simple_ptr(local_60,_WSI_TOKEN_CLIENT_METHOD);
        iVar6 = lws_hdr_total_length(local_60,_WSI_TOKEN_CLIENT_METHOD);
        if (pcVar9 != (char *)0x0 && 2 < iVar6) {
          _lws_log(8,"%s: 303 switching to GET\n","lws_client_interpret_server_handshake");
          builtin_strncpy(pcVar9,"GET",4);
          *(ulong *)&local_60->field_0x2dc = *(ulong *)&local_60->field_0x2dc | 0x10000000000000;
          paVar2 = (local_60->http).ah;
          paVar2->frags[paVar2->frag_index[0x5c]].len = 3;
        }
      }
      if ((*pcVar8 == '/') || (pcVar9 = strchr(pcVar8,0x3a), pcVar9 == (char *)0x0)) {
        ssl = (plVar7->tls).use_ssl & 1;
        local_40 = lws_hdr_simple_ptr(local_60,_WSI_TOKEN_CLIENT_PEER_ADDRESS);
        local_4c = (uint)plVar7->c_port;
        local_48 = pcVar8;
        if (*pcVar8 == '/') {
          local_48 = pcVar8 + 1;
        }
      }
      else {
        iVar6 = lws_parse_uri(pcVar8,&local_38,&local_40,(int *)&local_4c,&local_48);
        if (iVar6 != 0) {
          local_58 = "HS: URI did not parse";
          goto LAB_00127ae2;
        }
        iVar6 = strcmp(local_38,"wss");
        if (iVar6 != 0) {
          iVar6 = strcmp(local_38,"https");
          ssl = 0;
          if (iVar6 != 0) goto LAB_0012784c;
        }
        ssl = 1;
      }
LAB_0012784c:
      if ((((local_60->tls).use_ssl & 1) == 0) || (ssl != 0)) {
        if (local_40 == (char *)0x0) {
          local_58 = "no ads";
        }
        else {
          plVar7 = lws_client_reset(&local_60,ssl,local_40,local_4c,local_48,local_40,'\x01');
          if (plVar7 != (lws *)0x0) {
            return 0;
          }
          _lws_log(1,"Redirect failed\n");
          local_58 = "HS: Redirect failed";
          if (local_60 == (lws *)0x0) {
            return 1;
          }
        }
      }
      else {
        local_58 = "HS: Redirect attempted SSL downgrade";
      }
    }
  }
  else {
    pcVar8 = lws_hdr_simple_ptr(local_60,WSI_TOKEN_HTTP_COLON_STATUS);
    if (pcVar8 != (char *)0x0) goto LAB_00127656;
    local_58 = "HS: :status missing";
    pcVar8 = "no status\n";
LAB_001277df:
    _lws_log(8,pcVar8);
  }
LAB_00127ae2:
  reason = LWS_CLOSE_STATUS_NOSTATUS;
LAB_00127ae4:
  pcVar8 = local_58;
  plVar7 = local_60;
  if (local_60->protocol != (lws_protocols *)0x0) {
    if (local_58 == (char *)0x0) {
      len = 0;
    }
    else {
      sVar11 = strlen(local_58);
      len = sVar11 & 0xffffffff;
    }
    lws_inform_client_conn_fail(plVar7,pcVar8,len);
  }
  if (local_60->protocol == (lws_protocols *)0x0) {
    pcVar8 = "unknown";
  }
  else {
    pcVar8 = local_60->protocol->name;
  }
  _lws_log(8,"closing connection (prot %s) due to bail2 connection error: %s\n",pcVar8,local_58);
  lws_close_free_wsi(local_60,reason,"c hs interp");
  return 1;
}

Assistant:

int
lws_client_interpret_server_handshake(struct lws *wsi)
{
	int n, port = 0, ssl = 0;
	int close_reason = LWS_CLOSE_STATUS_PROTOCOL_ERR;
	const char *prot, *ads = NULL, *path, *cce = NULL;
	struct allocated_headers *ah, *ah1;
	struct lws *nwsi = lws_get_network_wsi(wsi);
	char *p, *q;
	char new_path[300];

	lws_free_set_NULL(wsi->stash);

	ah = wsi->http.ah;
	if (!wsi->do_ws) {
		/* we are being an http client...
		 */
#if defined(LWS_ROLE_H2)
		if (wsi->client_h2_alpn || wsi->client_mux_substream) {
			lwsl_debug("%s: %p: transitioning to h2 client\n",
				   __func__, wsi);
			lws_role_transition(wsi, LWSIFR_CLIENT,
					    LRS_ESTABLISHED, &role_ops_h2);
		} else
#endif
		{
#if defined(LWS_ROLE_H1)
			{
			lwsl_debug("%s: %p: transitioning to h1 client\n",
				   __func__, wsi);
			lws_role_transition(wsi, LWSIFR_CLIENT,
					    LRS_ESTABLISHED, &role_ops_h1);
			}
#else
			return -1;
#endif
		}

		wsi->http.ah = ah;
		ah->http_response = 0;
	}

	/*
	 * well, what the server sent looked reasonable for syntax.
	 * Now let's confirm it sent all the necessary headers
	 *
	 * http (non-ws) client will expect something like this
	 *
	 * HTTP/1.0.200
	 * server:.libwebsockets
	 * content-type:.text/html
	 * content-length:.17703
	 * set-cookie:.test=LWS_1456736240_336776_COOKIE;Max-Age=360000
	 */

	wsi->http.conn_type = HTTP_CONNECTION_KEEP_ALIVE;
	if (!wsi->client_mux_substream) {
		p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP);
		/*
		if (wsi->do_ws && !p) {
			lwsl_info("no URI\n");
			cce = "HS: URI missing";
			goto bail3;
		}
		*/
		if (!p) {
			p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP1_0);
			wsi->http.conn_type = HTTP_CONNECTION_CLOSE;
		}
		if (!p) {
			cce = "HS: URI missing";
			lwsl_info("no URI\n");
			goto bail3;
		}
	} else {
		p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_COLON_STATUS);
		if (!p) {
			cce = "HS: :status missing";
			lwsl_info("no status\n");
			goto bail3;
		}
	}
	n = atoi(p);
	if (ah)
		ah->http_response = n;

	if (!wsi->client_no_follow_redirect &&
#if defined(LWS_WITH_HTTP_PROXY)
	    !wsi->http.proxy_clientside &&
#endif
	    (n == 301 || n == 302 || n == 303 || n == 307 || n == 308)) {
		p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_LOCATION);
		if (!p) {
			cce = "HS: Redirect code but no Location";
			goto bail3;
		}

		/*
		 * Some redirect codes imply we have to change the method
		 * used for the subsequent transaction, commonly POST ->
		 * 303 -> GET.
		 */

		if (n == 303) {
			char *mp = lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_METHOD);
			int ml = lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_METHOD);

			if (ml >= 3 && mp) {
				lwsl_info("%s: 303 switching to GET\n", __func__);
				memcpy(mp, "GET", 4);
				wsi->redirected_to_get = 1;
				wsi->http.ah->frags[wsi->http.ah->frag_index[
				             _WSI_TOKEN_CLIENT_METHOD]].len = 3;
			}
		}

		/* Relative reference absolute path */
		if (p[0] == '/' || !strchr(p, ':')) {
#if defined(LWS_WITH_TLS)
			ssl = nwsi->tls.use_ssl & LCCSCF_USE_SSL;
#endif
			ads = lws_hdr_simple_ptr(wsi,
						 _WSI_TOKEN_CLIENT_PEER_ADDRESS);
			port = nwsi->c_port;
			path = p;
			/* lws_client_reset expects leading / omitted */
			if (*path == '/')
				path++;
		}
		/* Absolute (Full) URI */
		else if (strchr(p, ':')) {
			if (lws_parse_uri(p, &prot, &ads, &port, &path)) {
				cce = "HS: URI did not parse";
				goto bail3;
			}

			if (!strcmp(prot, "wss") || !strcmp(prot, "https"))
				ssl = LCCSCF_USE_SSL;
		}
		/* Relative reference relative path */
		else {
			/* This doesn't try to calculate an absolute path,
			 * that will be left to the server */
#if defined(LWS_WITH_TLS)
			ssl = nwsi->tls.use_ssl & LCCSCF_USE_SSL;
#endif
			ads = lws_hdr_simple_ptr(wsi,
						 _WSI_TOKEN_CLIENT_PEER_ADDRESS);
			port = wsi->c_port;
			/* +1 as lws_client_reset expects leading / omitted */
			path = new_path + 1;
			if (lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_URI))
				lws_strncpy(new_path, lws_hdr_simple_ptr(wsi,
				   _WSI_TOKEN_CLIENT_URI), sizeof(new_path));
			else {
				new_path[0] = '/';
				new_path[1] = '\0';
			}
			q = strrchr(new_path, '/');
			if (q)
				lws_strncpy(q + 1, p, sizeof(new_path) -
							(q - new_path) - 1);
			else
				path = p;
		}

#if defined(LWS_WITH_TLS)
		if ((wsi->tls.use_ssl & LCCSCF_USE_SSL) && !ssl) {
			cce = "HS: Redirect attempted SSL downgrade";
			goto bail3;
		}
#endif

		if (!ads) /* make coverity happy */ {
			cce = "no ads";
			goto bail3;
		}

		if (!lws_client_reset(&wsi, ssl, ads, port, path, ads, 1)) {
			/*
			 * There are two ways to fail out with NULL return...
			 * simple, early problem where the wsi is intact, or
			 * we went through with the reconnect attempt and the
			 * wsi is already closed.  In the latter case, the wsi
			 * has been set to NULL additionally.
			 */
			lwsl_err("Redirect failed\n");
			cce = "HS: Redirect failed";
			/* coverity[reverse_inull] */
			if (wsi)
				goto bail3;

			/* wsi has closed */
			return 1;
		}
		return 0;
	}

	if (!wsi->do_ws) {

		/* if h1 KA is allowed, enable the queued pipeline guys */

		if (!wsi->client_h2_alpn && !wsi->client_mux_substream) {
			/* ie, coming to this for the first time */
			if (wsi->http.conn_type == HTTP_CONNECTION_KEEP_ALIVE)
				wsi->keepalive_active = 1;
			else {
				/*
				 * Ugh... now the main http connection has seen
				 * both sides, we learn the server doesn't
				 * support keepalive.
				 *
				 * That means any guys queued on us are going
				 * to have to be restarted from connect2 with
				 * their own connections.
				 */

				/*
				 * stick around telling any new guys they can't
				 * pipeline to this server
				 */
				wsi->keepalive_rejected = 1;

				lws_vhost_lock(wsi->vhost);
				lws_start_foreach_dll_safe(struct lws_dll2 *,
							   d, d1,
				  wsi->dll2_cli_txn_queue_owner.head) {
					struct lws *ww = lws_container_of(d,
						struct lws,
						dll2_cli_txn_queue);

					/* remove him from our queue */
					lws_dll2_remove(&ww->dll2_cli_txn_queue);
					/* give up on pipelining */
					ww->client_pipeline = 0;

					/* go back to "trying to connect" state */
					lws_role_transition(ww, LWSIFR_CLIENT,
							    LRS_UNCONNECTED,
#if defined(LWS_ROLE_H1)
							    &role_ops_h1);
#else
#if defined (LWS_ROLE_H2)
							    &role_ops_h2);
#else
							    &role_ops_raw);
#endif
#endif
					ww->user_space = NULL;
				} lws_end_foreach_dll_safe(d, d1);
				lws_vhost_unlock(wsi->vhost);
			}
		}

#ifdef LWS_WITH_HTTP_PROXY
		wsi->http.perform_rewrite = 0;
		if (lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_CONTENT_TYPE)) {
			if (!strncmp(lws_hdr_simple_ptr(wsi,
						WSI_TOKEN_HTTP_CONTENT_TYPE),
						"text/html", 9))
				wsi->http.perform_rewrite = 0;
		}
#endif

		/* allocate the per-connection user memory (if any) */
		if (lws_ensure_user_space(wsi)) {
			lwsl_err("Problem allocating wsi user mem\n");
			cce = "HS: OOM";
			goto bail2;
		}

		/* he may choose to send us stuff in chunked transfer-coding */
		wsi->chunked = 0;
		wsi->chunk_remaining = 0; /* ie, next thing is chunk size */
		if (lws_hdr_total_length(wsi,
					WSI_TOKEN_HTTP_TRANSFER_ENCODING)) {
			wsi->chunked = !strcmp(lws_hdr_simple_ptr(wsi,
					       WSI_TOKEN_HTTP_TRANSFER_ENCODING),
						"chunked");
			/* first thing is hex, after payload there is crlf */
			wsi->chunk_parser = ELCP_HEX;
		}

		if (lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_CONTENT_LENGTH)) {
			wsi->http.rx_content_length =
					atoll(lws_hdr_simple_ptr(wsi,
						WSI_TOKEN_HTTP_CONTENT_LENGTH));
			lwsl_info("%s: incoming content length %llu\n",
				    __func__, (unsigned long long)
					    wsi->http.rx_content_length);
			wsi->http.rx_content_remain =
					wsi->http.rx_content_length;
		} else /* can't do 1.1 without a content length or chunked */
			if (!wsi->chunked)
				wsi->http.conn_type = HTTP_CONNECTION_CLOSE;

		/*
		 * we seem to be good to go, give client last chance to check
		 * headers and OK it
		 */
		ah1 = wsi->http.ah;
		wsi->http.ah = ah;
		if (wsi->protocol->callback(wsi,
				LWS_CALLBACK_CLIENT_FILTER_PRE_ESTABLISH,
					    wsi->user_space, NULL, 0)) {
			wsi->http.ah = ah1;
			cce = "HS: disallowed by client filter";
			goto bail2;
		}

		/* clear his proxy connection timeout */
		lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);

		wsi->rxflow_change_to = LWS_RXFLOW_ALLOW;

		/* call him back to inform him he is up */
		if (wsi->protocol->callback(wsi,
					    LWS_CALLBACK_ESTABLISHED_CLIENT_HTTP,
					    wsi->user_space, NULL, 0)) {
			wsi->http.ah = ah1;
			cce = "HS: disallowed at ESTABLISHED";
			goto bail3;
		}

		wsi->http.ah = ah1;

		lwsl_info("%s: client connection up\n", __func__);

		/*
		 * Did we get a response from the server with an explicit
		 * content-length of zero?  If so, this transaction is already
		 * completed at the end of the header processing...
		 */
		if (lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_CONTENT_LENGTH) &&
		    !wsi->http.rx_content_length)
		        return !!lws_http_transaction_completed_client(wsi);

		return 0;
	}

#if defined(LWS_ROLE_WS)
	switch (lws_client_ws_upgrade(wsi, &cce)) {
	case 2:
		goto bail2;
	case 3:
		goto bail3;
	}

	return 0;
#endif

bail3:
	close_reason = LWS_CLOSE_STATUS_NOSTATUS;

bail2:
	if (wsi->protocol) {
		n = 0;
		if (cce)
			n = (int)strlen(cce);

		lws_inform_client_conn_fail(wsi, (void *)cce, (unsigned int)n);
	}

	lwsl_info("closing connection (prot %s) "
		  "due to bail2 connection error: %s\n", wsi->protocol ?
				  wsi->protocol->name : "unknown", cce);

	/* closing will free up his parsing allocations */
	lws_close_free_wsi(wsi, close_reason, "c hs interp");

	return 1;
}